

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

uchar * stbtt_GetGlyphBitmapSubpixel
                  (stbtt_fontinfo *info,float scale_x,float scale_y,float shift_x,float shift_y,
                  int glyph,int *width,int *height,int *xoff,int *yoff)

{
  int num_verts_00;
  stbtt_vertex *psStack_80;
  int num_verts;
  stbtt_vertex *vertices;
  stbtt__bitmap gbm;
  int iy1;
  int ix1;
  int iy0;
  int ix0;
  int *yoff_local;
  int *xoff_local;
  int *height_local;
  int *width_local;
  float local_28;
  int glyph_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  stbtt_fontinfo *info_local;
  
  _iy0 = yoff;
  yoff_local = xoff;
  xoff_local = height;
  height_local = width;
  width_local._4_4_ = glyph;
  local_28 = shift_y;
  glyph_local = (int)shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  _scale_y_local = info;
  num_verts_00 = stbtt_GetGlyphShape(info,glyph,&stack0xffffffffffffff80);
  if ((shift_x_local == 0.0) && (!NAN(shift_x_local))) {
    shift_x_local = shift_y_local;
  }
  if ((shift_y_local == 0.0) && (!NAN(shift_y_local))) {
    if ((shift_x_local == 0.0) && (!NAN(shift_x_local))) {
      free(psStack_80);
      return (uchar *)0x0;
    }
    shift_y_local = shift_x_local;
  }
  stbtt_GetGlyphBitmapBoxSubpixel
            (_scale_y_local,width_local._4_4_,shift_x_local,shift_y_local,(float)glyph_local,
             local_28,&ix1,&iy1,(int *)((long)&gbm.pixels + 4),(int *)&gbm.pixels);
  vertices._0_4_ = gbm.pixels._4_4_ - ix1;
  vertices._4_4_ = (int)gbm.pixels - iy1;
  gbm.stride = 0;
  gbm._12_4_ = 0;
  if (height_local != (int *)0x0) {
    *height_local = (int)vertices;
  }
  if (xoff_local != (int *)0x0) {
    *xoff_local = vertices._4_4_;
  }
  if (yoff_local != (int *)0x0) {
    *yoff_local = ix1;
  }
  if (_iy0 != (int *)0x0) {
    *_iy0 = iy1;
  }
  if ((((int)vertices != 0) && (vertices._4_4_ != 0)) &&
     (gbm._8_8_ = malloc((long)((int)vertices * vertices._4_4_)), (void *)gbm._8_8_ != (void *)0x0))
  {
    gbm.w = (int)vertices;
    stbtt_Rasterize((stbtt__bitmap *)&vertices,0.35,psStack_80,num_verts_00,shift_x_local,
                    shift_y_local,(float)glyph_local,local_28,ix1,iy1,1,_scale_y_local->userdata);
  }
  free(psStack_80);
  return (uchar *)gbm._8_8_;
}

Assistant:

STBTT_DEF unsigned char *stbtt_GetGlyphBitmapSubpixel(const stbtt_fontinfo *info, float scale_x, float scale_y, float shift_x, float shift_y, int glyph, int *width, int *height, int *xoff, int *yoff)
{
   int ix0,iy0,ix1,iy1;
   stbtt__bitmap gbm;
   stbtt_vertex *vertices;
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);

   if (scale_x == 0) scale_x = scale_y;
   if (scale_y == 0) {
      if (scale_x == 0) {
         STBTT_free(vertices, info->userdata);
         return NULL;
      }
      scale_y = scale_x;
   }

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,&ix1,&iy1);

   // now we get the size
   gbm.w = (ix1 - ix0);
   gbm.h = (iy1 - iy0);
   gbm.pixels = NULL; // in case we error

   if (width ) *width  = gbm.w;
   if (height) *height = gbm.h;
   if (xoff  ) *xoff   = ix0;
   if (yoff  ) *yoff   = iy0;

   if (gbm.w && gbm.h) {
      gbm.pixels = (unsigned char *) STBTT_malloc(gbm.w * gbm.h, info->userdata);
      if (gbm.pixels) {
         gbm.stride = gbm.w;

         stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0, iy0, 1, info->userdata);
      }
   }
   STBTT_free(vertices, info->userdata);
   return gbm.pixels;
}